

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  mapped_type *this_00;
  CacheIterator CVar9;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  mapped_type *local_88;
  CacheEntry *ne;
  undefined1 local_70 [8];
  CacheIterator it;
  string key;
  size_type plen;
  char **p;
  char *end;
  CacheEntry *e_local;
  string *entryKey_local;
  cmCacheManager *this_local;
  
  if (e->Type == INTERNAL) {
    lVar3 = std::__cxx11::string::c_str();
    lVar4 = std::__cxx11::string::size();
    for (plen = (size_type)PersistentProperties; *(long *)plen != 0; plen = plen + 8) {
      sVar5 = strlen(*(char **)plen);
      uVar6 = sVar5 + 1;
      uVar7 = std::__cxx11::string::size();
      if (((uVar6 < uVar7) && (*(char *)((lVar3 + lVar4) - uVar6) == '-')) &&
         (iVar2 = strcmp((char *)(((lVar3 + lVar4) - uVar6) + 1),*(char **)plen), iVar2 == 0)) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&it.Position,(ulong)entryKey);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        CVar9 = GetCacheIterator(this,pcVar8);
        it.Container = (cmCacheManager *)CVar9.Position._M_node;
        local_70 = (undefined1  [8])CVar9.Container;
        bVar1 = CacheIterator::IsAtEnd((CacheIterator *)local_70);
        if (bVar1) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&this->Cache,(key_type *)&it.Position);
          this_00->Type = UNINITIALIZED;
          pcVar8 = *(char **)plen;
          local_88 = this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a8,pcVar8,&local_a9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty(this_00,&local_a8,pcVar8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
        else {
          pcVar8 = *(char **)plen;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d0,pcVar8,&local_d1);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          CacheIterator::SetProperty((CacheIterator *)local_70,&local_d0,pcVar8);
          std::__cxx11::string::~string((string *)&local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        }
        std::__cxx11::string::~string((string *)&it.Position);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(std::string const& entryKey,
                                       CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char** p = this->PersistentProperties; *p; ++p) {
    std::string::size_type plen = strlen(*p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, *p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      cmCacheManager::CacheIterator it = this->GetCacheIterator(key.c_str());
      if (it.IsAtEnd()) {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.Type = cmStateEnums::UNINITIALIZED;
        ne.SetProperty(*p, e.Value.c_str());
      } else {
        // Store this property on its entry.
        it.SetProperty(*p, e.Value.c_str());
      }
      return true;
    }
  }
  return false;
}